

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

vorbis_info * ov_info(OggVorbis_File *vf,int link)

{
  int link_local;
  OggVorbis_File *vf_local;
  
  if (vf->seekable == 0) {
    vf_local = (OggVorbis_File *)vf->vi;
  }
  else if (link < 0) {
    if (vf->ready_state < 3) {
      vf_local = (OggVorbis_File *)vf->vi;
    }
    else {
      vf_local = (OggVorbis_File *)(vf->vi + vf->current_link);
    }
  }
  else if (link < vf->links) {
    vf_local = (OggVorbis_File *)(vf->vi + link);
  }
  else {
    vf_local = (OggVorbis_File *)0x0;
  }
  return (vorbis_info *)vf_local;
}

Assistant:

vorbis_info *ov_info(OggVorbis_File *vf,int link){
  if(vf->seekable){
    if(link<0)
      if(vf->ready_state>=STREAMSET)
        return vf->vi+vf->current_link;
      else
      return vf->vi;
    else
      if(link>=vf->links)
        return NULL;
      else
        return vf->vi+link;
  }else{
    return vf->vi;
  }
}